

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O3

bool stl_reader::
     ReadStlFile_BINARY<lume::ArrayAnnex<float>,lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>,lume::ArrayAnnex<unsigned_int>>
               (char *filename,ArrayAnnex<float> *coordsOut,ArrayAnnex<float> *normalsOut,
               ArrayAnnex<unsigned_int> *trisOut,ArrayAnnex<unsigned_int> *solidRangesOut)

{
  pointer pfVar1;
  pointer puVar2;
  iterator __position;
  undefined8 uVar3;
  int iVar4;
  uint *puVar5;
  runtime_error *prVar6;
  float fVar7;
  uint uVar8;
  iterator iVar9;
  long lVar10;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  coordsWithIndex;
  uint numTris;
  char addData [2];
  float d [12];
  stringstream ss;
  char stl_header [80];
  ifstream in;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  local_4a8;
  char *local_488;
  uint local_47c;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_478;
  undefined1 local_46a [2];
  string local_468 [8];
  float afStack_460 [10];
  ArrayAnnex<float> *local_438;
  string local_430 [32];
  CoordWithIndex<float,_unsigned_int> local_410;
  ostream local_400 [376];
  string local_288 [80];
  long local_238 [4];
  byte abStack_218 [488];
  
  pfVar1 = (coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  pfVar1 = (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  puVar2 = (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (solidRangesOut->m_vector).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  local_488 = filename;
  local_438 = coordsOut;
  std::ifstream::ifstream(local_238,filename,_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_410);
    std::__ostream_insert<char,std::char_traits<char>>(local_400,"Couldnt open file ",0x12);
    std::operator<<(local_400,local_488);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_288);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read((char *)local_238,(long)local_288);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_410);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_400,"Error while parsing binary stl header in file ",0x2e);
    std::operator<<(local_400,local_488);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_468);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_47c = 0;
  std::istream::read((char *)local_238,(long)&local_47c);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_4a8.
    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4a8.
    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (CoordWithIndex<float,_unsigned_int> *)0x0;
    local_4a8.
    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (CoordWithIndex<float,_unsigned_int> *)0x0;
    if (local_47c != 0) {
      local_478 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&trisOut->m_vector;
      uVar8 = 0;
      do {
        std::istream::read((char *)local_238,(long)local_468);
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_410);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_400,"Error while parsing trianlge in binary stl file ",0x30);
          std::operator<<(local_400,local_488);
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar6,local_430);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar10 = 0;
        do {
          __position._M_current =
               (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&normalsOut->m_vector,__position,
                       (float *)(local_468 + lVar10));
          }
          else {
            *__position._M_current = *(float *)(local_468 + lVar10);
            (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0xc);
        lVar10 = 0xc;
        do {
          local_410.data[2] = *(float *)((long)afStack_460 + lVar10);
          uVar3 = *(undefined8 *)(local_468 + lVar10);
          local_410.data[0] = (float)uVar3;
          local_410.data[1] = SUB84(uVar3,4);
          local_410.index =
               (uint)((ulong)((long)local_4a8.
                                    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_4a8.
                                   super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
          if (local_4a8.
              super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_4a8.
              super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>>>
            ::
            _M_realloc_insert<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>const&>
                      ((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>>>
                        *)&local_4a8,
                       (iterator)
                       local_4a8.
                       super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_410);
          }
          else {
            *(undefined8 *)
             (local_4a8.
              super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->data = uVar3;
            *(ulong *)((local_4a8.
                        super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data + 2) =
                 CONCAT44(local_410.index,local_410.data[2]);
            local_4a8.
            super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_4a8.
                 super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          lVar10 = lVar10 + 0xc;
        } while (lVar10 != 0x30);
        iVar4 = (int)((ulong)((long)local_4a8.
                                    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_4a8.
                                   super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
        iVar9._M_current =
             (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        puVar5 = (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (iVar9._M_current == puVar5) {
          local_410.data[0] = (float)(iVar4 - 3U);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_478,iVar9,(uint *)&local_410);
          iVar9._M_current =
               (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          puVar5 = (trisOut->m_vector).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          iVar4 = (int)((ulong)((long)local_4a8.
                                      super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_4a8.
                                     super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        else {
          *iVar9._M_current = iVar4 - 3U;
          iVar9._M_current = iVar9._M_current + 1;
          (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current;
        }
        local_410.data[0] = (float)(iVar4 - 2);
        if (iVar9._M_current == puVar5) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_478,iVar9,(uint *)&local_410);
          iVar9._M_current =
               (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          puVar5 = (trisOut->m_vector).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          iVar4 = (int)((ulong)((long)local_4a8.
                                      super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_4a8.
                                     super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        else {
          *iVar9._M_current = (uint)local_410.data[0];
          iVar9._M_current = iVar9._M_current + 1;
          (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current;
        }
        local_410.data[0] = (float)(iVar4 - 1U);
        if (iVar9._M_current == puVar5) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_478,iVar9,(uint *)&local_410);
        }
        else {
          *iVar9._M_current = iVar4 - 1U;
          (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
        std::istream::read((char *)local_238,(long)local_46a);
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_410);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_400,"Error while parsing additional triangle data in binary stl file ",
                     0x40);
          std::operator<<(local_400,local_488);
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar6,local_430);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_47c);
    }
    local_410.data._0_8_ = local_410.data._0_8_ & 0xffffffff00000000;
    iVar9._M_current =
         (solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    puVar5 = (solidRangesOut->m_vector).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar9._M_current == puVar5) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&solidRangesOut->m_vector,
                 iVar9,(uint *)&local_410);
      iVar9._M_current =
           (solidRangesOut->m_vector).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar5 = (solidRangesOut->m_vector).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar9._M_current = 0;
      iVar9._M_current = iVar9._M_current + 1;
      (solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current;
    }
    fVar7 = (float)(((ulong)((long)(trisOut->m_vector).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(trisOut->m_vector).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff) / 3);
    local_410.data[0] = fVar7;
    if (iVar9._M_current == puVar5) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&solidRangesOut->m_vector,
                 iVar9,(uint *)&local_410);
    }
    else {
      *iVar9._M_current = (uint)fVar7;
      (solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
    }
    stl_reader_impl::RemoveDoubles<lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>>
              (local_438,trisOut,&local_4a8);
    if (local_4a8.
        super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4a8.
                      super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4a8.
                            super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4a8.
                            super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::ifstream::~ifstream(local_238);
    return true;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_410);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_400,"Couldnt determine number of triangles in binary stl file ",0x39);
  std::operator<<(local_400,local_488);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,local_468);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadStlFile_BINARY(const char* filename,
                        TNumberContainer1& coordsOut,
                        TNumberContainer2& normalsOut,
                        TIndexContainer1& trisOut,
					    TIndexContainer2& solidRangesOut)
{
	using namespace std;
	using namespace stl_reader_impl;

	typedef typename TNumberContainer1::value_type	number_t;
	typedef typename TIndexContainer1::value_type	index_t;

	coordsOut.clear();
	normalsOut.clear();
	trisOut.clear();
	solidRangesOut.clear();

	ifstream in(filename, ios::binary);
	STL_READER_COND_THROW(!in, "Couldnt open file " << filename);

	char stl_header[80];
	in.read(stl_header, 80);
	STL_READER_COND_THROW(!in, "Error while parsing binary stl header in file " << filename);

	unsigned int numTris = 0;
	in.read((char*)&numTris, 4);
	STL_READER_COND_THROW(!in, "Couldnt determine number of triangles in binary stl file " << filename);

	vector<CoordWithIndex <number_t, index_t> > coordsWithIndex;

	for(unsigned int tri = 0; tri < numTris; ++tri){
		float d[12];
		in.read((char*)d, 12 * 4);
		STL_READER_COND_THROW(!in, "Error while parsing trianlge in binary stl file " << filename);

		for(int i = 0; i < 3; ++i)
			normalsOut.push_back (d[i]);

		for(size_t ivrt = 1; ivrt < 4; ++ivrt){
			CoordWithIndex <number_t, index_t> c;
			for(size_t i = 0; i < 3; ++i)
				c[i] = d[ivrt * 3 + i];
			c.index = static_cast<index_t>(coordsWithIndex.size());
			coordsWithIndex.push_back(c);
		}

		trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 3));
		trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 2));
		trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 1));

		char addData[2];
		in.read(addData, 2);
		STL_READER_COND_THROW(!in, "Error while parsing additional triangle data in binary stl file " << filename);
	}

	solidRangesOut.push_back(0);
	solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));

	RemoveDoubles (coordsOut, trisOut, coordsWithIndex);

	return true;
}